

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# refcount.h
# Opt level: O2

Own<kj::(anonymous_namespace)::NetworkAddressHttpClient::RefcountedClient> __thiscall
kj::
refcounted<kj::(anonymous_namespace)::NetworkAddressHttpClient::RefcountedClient,kj::(anonymous_namespace)::NetworkAddressHttpClient&,kj::Own<kj::(anonymous_namespace)::HttpClientImpl>>
          (kj *this,NetworkAddressHttpClient *params,
          Own<kj::(anonymous_namespace)::HttpClientImpl> *params_1)

{
  HttpClientImpl *pHVar1;
  Refcounted *refcounted;
  undefined8 *puVar2;
  RefcountedClient *extraout_RDX;
  Own<kj::(anonymous_namespace)::NetworkAddressHttpClient::RefcountedClient> OVar3;
  Own<kj::(anonymous_namespace)::HttpClientImpl> local_28;
  
  puVar2 = (undefined8 *)operator_new(0x28);
  local_28.disposer = params_1->disposer;
  pHVar1 = params_1->ptr;
  params_1->ptr = (HttpClientImpl *)0x0;
  *puVar2 = &PTR_disposeImpl_0042aaf0;
  puVar2[2] = params;
  puVar2[3] = local_28.disposer;
  local_28.ptr = (HttpClientImpl *)0x0;
  puVar2[4] = pHVar1;
  params->activeConnectionCount = params->activeConnectionCount + 1;
  *(undefined4 *)(puVar2 + 1) = 1;
  *(undefined8 **)this = puVar2;
  *(undefined8 **)(this + 8) = puVar2;
  Own<kj::(anonymous_namespace)::HttpClientImpl>::~Own(&local_28);
  OVar3.ptr = extraout_RDX;
  OVar3.disposer = (Disposer *)this;
  return OVar3;
}

Assistant:

inline Own<T> refcounted(Params&&... params) {
  // Allocate a new refcounted instance of T, passing `params` to its constructor.  Returns an
  // initial reference to the object.  More references can be created with `kj::addRef()`.

  return Refcounted::addRefInternal(new T(kj::fwd<Params>(params)...));
}